

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::reportError(Parser *this,shared_ptr<Token> *token,string *errorMessage)

{
  ostream *out;
  element_type *peVar1;
  element_type *__r;
  shared_ptr<const_Readable> local_58;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *errorMessage_local;
  shared_ptr<Token> *token_local;
  Parser *this_local;
  
  out = this->out;
  local_20 = errorMessage;
  errorMessage_local = (string *)token;
  token_local = (shared_ptr<Token> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"syntactic analysis",&local_41);
  peVar1 = std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  __r = std::__shared_ptr_access<Tokenizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Tokenizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &peVar1->tokenizer);
  std::shared_ptr<Readable_const>::shared_ptr<Readable,void>
            ((shared_ptr<Readable_const> *)&local_58,&__r->reader);
  Error::reportErrorAtToken
            (out,&local_40,&local_58,(shared_ptr<Token> *)errorMessage_local,local_20);
  std::shared_ptr<const_Readable>::~shared_ptr(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void Parser::reportError(
    const std::shared_ptr<Token>& token,
    const std::string & errorMessage) noexcept {

  Error::reportErrorAtToken(
    this->out,
    "syntactic analysis",
    this->tokenBuffer->tokenizer->reader,
    token, errorMessage);
}